

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

bool vkt::shaderexecutor::ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::
     doContains(IVal *ival,Vector<float,_2> *value)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == 2) break;
    bVar2 = contains<float>(ival->m_data,value->m_data);
    value = (Vector<float,_2> *)((long)value + 4);
    ival = (IVal *)((long)ival + 0x18);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return 1 < uVar3;
}

Assistant:

static bool			doContains		(const IVal& ival, const T& value)
	{
		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			if (!contains(ival[ndx], value[ndx]))
				return false;

		return true;
	}